

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O3

_Bool fiber_yield(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_fiber_t *fiber;
  gravity_fiber_t *pgVar1;
  nanotime_t nVar2;
  gravity_value_t value;
  
  value.field_1.n = 0;
  value.isa = gravity_class_null;
  gravity_vm_setslot(vm,value,rindex);
  pgVar1 = gravity_vm_fiber(vm);
  pgVar1->timewait = 0.0;
  nVar2 = nanotime();
  pgVar1->lasttime = nVar2;
  fiber = pgVar1->caller;
  if (fiber != (gravity_fiber_t *)0x0) {
    gravity_vm_setfiber(vm,fiber);
    pgVar1->caller = (fiber_s *)0x0;
    pgVar1->trying = false;
  }
  return fiber == (gravity_fiber_t *)0x0;
}

Assistant:

static bool fiber_yield (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(args, nargs, rindex)

    // set rindex slot to NULL in order to falsify the if closure check performed by the VM
    gravity_vm_setslot(vm, VALUE_FROM_NULL, rindex);

    // get currently executed fiber
    gravity_fiber_t *fiber = gravity_vm_fiber(vm);

    // reset wait time and update last time
    fiber->timewait = 0.0f;
    fiber->lasttime = nanotime();
    
    // in no caller then this is just a NOP
    if (fiber->caller) {
        gravity_vm_setfiber(vm, fiber->caller);
    
        // unhook this fiber from the one that called it
        fiber->caller = NULL;
        fiber->trying = false;
    
        RETURN_FIBER();
    } else {
        RETURN_NOVALUE();
    }
}